

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O3

void __thiscall AST::WhileStmt::~WhileStmt(WhileStmt *this)

{
  BlockStmt *pBVar1;
  Expr *pEVar2;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__WhileStmt_001816f0;
  pBVar1 = (this->m_body)._M_t.
           super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>._M_t.
           super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
           super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl;
  if (pBVar1 != (BlockStmt *)0x0) {
    (*(pBVar1->super_Stmt)._vptr_Stmt[1])();
  }
  (this->m_body)._M_t.super___uniq_ptr_impl<AST::BlockStmt,_std::default_delete<AST::BlockStmt>_>.
  _M_t.super__Tuple_impl<0UL,_AST::BlockStmt_*,_std::default_delete<AST::BlockStmt>_>.
  super__Head_base<0UL,_AST::BlockStmt_*,_false>._M_head_impl = (BlockStmt *)0x0;
  pEVar2 = (this->m_condition)._M_t.
           super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
           super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  if (pEVar2 != (Expr *)0x0) {
    (*(pEVar2->super_Stmt)._vptr_Stmt[1])();
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit WhileStmt(std::unique_ptr<Expr> condition, std::unique_ptr<BlockStmt> body)
        : m_condition(std::move(condition))
        , m_body(std::move(body)) { }